

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O3

void __thiscall
ReleaseSite::ReleaseSite
          (ReleaseSite *this,string *name,int start,int stop,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *interactions)

{
  _Rb_tree_node_base *p_Var1;
  invalid_argument *this_00;
  long *plVar2;
  long *plVar3;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  FixedElement::FixedElement(&this->super_FixedElement,name,start,stop,interactions);
  (this->super_FixedElement)._vptr_FixedElement = (_func_int **)&PTR__FixedElement_001a55d0;
  *(undefined2 *)&(this->super_FixedElement).first_exposure_ = 0;
  p_Var1 = (interactions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 == &(interactions->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    if ((*(double *)(p_Var1 + 2) < 0.0) || (1.0 < *(double *)(p_Var1 + 2))) break;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"Release site \'",&(this->super_FixedElement).name_);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_68 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_68 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ReleaseSite::ReleaseSite(const std::string &name, int start, int stop,
                         const std::map<std::string, double> &interactions)
    : FixedElement(name, start, stop, interactions) {
  first_exposure_ = false;
  readthrough_ = false;
  for (auto const &item : interactions) {
    if (item.second < 0 || item.second > 1) {
      throw std::invalid_argument(
          "Release site '" + name_ +
          "' must have efficiency values between 0.0 and 1.0.");
    }
  }
}